

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf,bool sparse)

{
  pointer ppJVar1;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  undefined8 uVar5;
  ostream *this_00;
  void *this_01;
  pointer ppJVar6;
  reference pvVar7;
  pointer puVar8;
  Scope *pSVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *A_00;
  Scope *Ascope;
  Scope *YIIscope;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  byte in_DL;
  uint in_ESI;
  long *in_RDI;
  double dVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar15 [16];
  undefined1 extraout_var [56];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Index in_stack_0000007c;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_00000080;
  double post_p_o_1;
  Index joI_2;
  Index joI_1;
  double p_total;
  Index post_sucsI_1;
  Index jaI_1;
  Index post_sI_1;
  double p_o_sum;
  double post_p_o;
  double p_o;
  vector<unsigned_int,_std::allocator<unsigned_int>_> O;
  Index joI;
  double post_p_given_sf;
  double p_t_sum;
  double post_p_t;
  double p_t;
  Index post_sucsI;
  Index post_sI;
  size_t i_2;
  Scope post_Y_Sc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_X;
  Index jaI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  Scope sfScope;
  size_t i_1;
  Scope AScope;
  Scope YScope;
  Scope XScope;
  ObservationModelDiscrete *marginalized_om;
  TransitionModelDiscrete *marginalized_tm;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *actions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> output_factor_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_factor_sizes;
  size_t nrX;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_factor_sizes;
  size_t nrS;
  Scope *YSoI_sf;
  Scope *in_stack_fffffffffffffb28;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffb30;
  allocator_type *in_stack_fffffffffffffb38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  uint uVar19;
  int in_stack_fffffffffffffb64;
  uint uVar20;
  int in_stack_fffffffffffffb68;
  uint uVar21;
  int in_stack_fffffffffffffb6c;
  uint uVar22;
  ObservationModelMappingSparse *in_stack_fffffffffffffb70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  EventObservationModelMappingSparse *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffc80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc90;
  Scope *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  uint local_240;
  uint local_23c;
  double local_238;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_1ec;
  ulong local_1c0;
  undefined1 local_1b8 [84];
  undefined4 local_164;
  Scope local_160;
  undefined4 local_144;
  undefined1 local_140 [28];
  undefined4 local_124;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120 [2];
  Scope *local_f0;
  Scope *local_a0;
  pointer local_98;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  size_t *local_58;
  pointer local_50;
  pointer local_30;
  Scope *local_18;
  byte local_d;
  uint local_c;
  undefined1 auVar16 [64];
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_18 = TwoStageDynamicBayesianNetwork::GetYSoI_Y
                       ((TwoStageDynamicBayesianNetwork *)in_stack_fffffffffffffb30,
                        (Index)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(in_stack_fffffffffffffb40)
  ;
  if (bVar2) {
    this_00 = std::operator<<((ostream *)&std::cout,"Marginalizing State Factor ");
    this_01 = (void *)std::ostream::operator<<(this_00,local_c);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_30 = (pointer)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xae9a0e);
    for (local_50 = (pointer)0x0; ppJVar1 = local_50,
        ppJVar6 = (pointer)(**(code **)(*in_RDI + 0xa8))(), ppJVar1 < ppJVar6;
        local_50 = (pointer)((long)local_50 + 1)) {
      if (local_50 != (pointer)(ulong)local_c) {
        local_58 = (size_t *)(**(code **)(*in_RDI + 0xc0))(in_RDI,(ulong)local_50 & 0xffffffff);
        local_30 = (pointer)((long)local_30 * (long)local_58);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb40,(value_type_conflict2 *)in_stack_fffffffffffffb38);
      }
    }
    (**(code **)(*in_RDI + 0xb8))();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb80,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb78);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_70,(ulong)local_c);
    *pvVar7 = 1;
    (**(code **)(*in_RDI + 0xb8))();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb80,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb78);
    local_90 = (pointer)(**(code **)(*in_RDI + 0x100))();
    if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
      ConstructJointActions((MultiAgentDecisionProcessDiscreteFactoredStates *)0xae9be9);
    }
    if ((*(byte *)((long)in_RDI + 0x242) & 1) == 0) {
      ConstructJointObservations((MultiAgentDecisionProcessDiscreteFactoredStates *)0xae9c3d);
    }
    *(byte *)((long)in_RDI + 0x241) = local_d & 1;
    *(byte *)((long)in_RDI + 0x243) = local_d & 1;
    if ((*(byte *)((long)in_RDI + 0x244) & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0x241) & 1) == 0) {
        puVar8 = (pointer)operator_new(0x28);
        (**(code **)(*in_RDI + 0x110))();
        TransitionModelMapping::TransitionModelMapping
                  ((TransitionModelMapping *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(int)in_stack_fffffffffffffb58);
        local_98 = puVar8;
      }
      else {
        puVar8 = (pointer)operator_new(0x28);
        (**(code **)(*in_RDI + 0x110))();
        TransitionModelMappingSparse::TransitionModelMappingSparse
                  ((TransitionModelMappingSparse *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(int)in_stack_fffffffffffffb58);
        local_98 = puVar8;
      }
      if ((*(byte *)((long)in_RDI + 0x243) & 1) == 0) {
        in_stack_fffffffffffffc98 = (Scope *)operator_new(0x30);
        in_stack_fffffffffffffc90 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(**(code **)(*in_RDI + 0x110))()
        ;
        in_stack_fffffffffffffc7c = SUB84(in_stack_fffffffffffffc90,0);
        in_stack_fffffffffffffc80 =
             (TwoStageDynamicBayesianNetwork *)(**(code **)(*in_RDI + 0x170))();
        ObservationModelMapping::ObservationModelMapping
                  ((ObservationModelMapping *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
        local_a0 = in_stack_fffffffffffffc98;
      }
      else {
        pSVar9 = (Scope *)operator_new(0x30);
        in_stack_fffffffffffffcb4 = local_30._0_4_;
        in_stack_fffffffffffffca4 = (**(code **)(*in_RDI + 0x110))();
        in_stack_fffffffffffffca8 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(**(code **)(*in_RDI + 0x170))()
        ;
        ObservationModelMappingSparse::ObservationModelMappingSparse
                  (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,
                   in_stack_fffffffffffffb64);
        local_a0 = pSVar9;
      }
    }
    else {
      if ((*(byte *)((long)in_RDI + 0x241) & 1) == 0) {
        puVar8 = (pointer)operator_new(0x28);
        (**(code **)(*in_RDI + 0x110))();
        TransitionModelMapping::TransitionModelMapping
                  ((TransitionModelMapping *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(int)in_stack_fffffffffffffb58);
        local_98 = puVar8;
      }
      else {
        puVar8 = (pointer)operator_new(0x28);
        (**(code **)(*in_RDI + 0x110))();
        TransitionModelMappingSparse::TransitionModelMappingSparse
                  ((TransitionModelMappingSparse *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(int)in_stack_fffffffffffffb58);
        local_98 = puVar8;
      }
      if ((*(byte *)((long)in_RDI + 0x243) & 1) == 0) {
        pSVar9 = (Scope *)operator_new(0x30);
        (**(code **)(*in_RDI + 0x110))();
        (**(code **)(*in_RDI + 0x170))();
        EventObservationModelMapping::EventObservationModelMapping
                  ((EventObservationModelMapping *)in_stack_fffffffffffffb90,
                   (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88,
                   (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        local_a0 = pSVar9;
      }
      else {
        pSVar9 = (Scope *)operator_new(0x30);
        (**(code **)(*in_RDI + 0x110))();
        (**(code **)(*in_RDI + 0x170))();
        EventObservationModelMappingSparse::EventObservationModelMappingSparse
                  (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                   (int)in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        local_a0 = pSVar9;
      }
    }
    A_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(**(code **)(*in_RDI + 0xb0))();
    Scope::Scope((Scope *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    Scope::Scope((Scope *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    Scope::Scope((Scope *)in_stack_fffffffffffffb30);
    local_f0 = (Scope *)0x0;
    while (pSVar9 = local_f0, Ascope = (Scope *)(**(code **)(*in_RDI + 0x10))(), pSVar9 < Ascope) {
      Scope::Insert((Scope *)in_stack_fffffffffffffb30,
                    (Index)((ulong)in_stack_fffffffffffffb28 >> 0x20));
      local_f0 = (Scope *)((long)&(local_f0->super_SDT).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
    }
    Scope::Scope((Scope *)in_stack_fffffffffffffb30);
    Scope::Insert((Scope *)in_stack_fffffffffffffb30,
                  (Index)((ulong)in_stack_fffffffffffffb28 >> 0x20));
    YIIscope = (Scope *)(**(code **)(*in_RDI + 0xa8))();
    local_124 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaea418);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48,
               (value_type_conflict1 *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaea44c);
    (**(code **)(*in_RDI + 0x10))();
    local_144 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaea487);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48,
               (value_type_conflict1 *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaea4bb);
    (**(code **)(*in_RDI + 0xa8))();
    local_164 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaea4f9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48,
               (value_type_conflict1 *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaea52d);
    do {
      local_1b8._76_4_ = (**(code **)(*in_RDI + 0x138))(in_RDI,local_140);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xaea571);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xaea57e);
      Scope::Scope((Scope *)in_stack_fffffffffffffb30);
      for (local_1c0 = 0;
          sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             (&local_160.super_SDT), local_1c0 < sVar10; local_1c0 = local_1c0 + 1)
      {
        if (local_1c0 != local_c) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_120,local_1c0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffffb40,(value_type_conflict1 *)in_stack_fffffffffffffb38);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (&local_160.super_SDT,local_1c0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffffb40,(value_type_conflict1 *)in_stack_fffffffffffffb38);
          Scope::Insert((Scope *)in_stack_fffffffffffffb30,
                        (Index)((ulong)in_stack_fffffffffffffb28 >> 0x20));
        }
      }
      IVar3 = IndexTools::IndividualToJointIndices
                        (in_stack_fffffffffffffb48,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb40);
      IVar4 = IndexTools::IndividualToJointIndices
                        (in_stack_fffffffffffffb48,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffb40);
      auVar15._0_8_ =
           TwoStageDynamicBayesianNetwork::GetYProbability
                     (in_stack_fffffffffffffc80,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),A_00,
                      &Ascope->super_SDT);
      bVar2 = Globals::EqualProbability
                        ((double)in_stack_fffffffffffffb30,(double)in_stack_fffffffffffffb28);
      if (!bVar2) {
        dVar13 = (double)(**(code **)(*(long *)local_98 + 0x20))
                                   (local_98,IVar3,local_1b8._76_4_,IVar4);
        if (1e-12 < dVar13 + auVar15._0_8_) {
          (**(code **)(*(long *)local_98 + 0x28))
                    (dVar13 + auVar15._0_8_,local_98,IVar3,local_1b8._76_4_,IVar4);
        }
      }
      in_stack_fffffffffffffb38 = (allocator_type *)(local_1b8 + 0x18);
      in_stack_fffffffffffffb30 = (MultiAgentDecisionProcessDiscreteFactoredStates *)local_1b8;
      in_stack_fffffffffffffb28 = &local_160;
      dVar13 = TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
                         (in_stack_fffffffffffffc80,
                          (Scope *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          A_00,Ascope,&pSVar9->super_SDT,YIIscope,in_stack_fffffffffffffc90,
                          in_stack_fffffffffffffc98,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      for (local_1ec = 0; uVar11 = (**(code **)(*in_RDI + 0x170))(), local_1ec < uVar11;
          local_1ec = local_1ec + 1) {
        (**(code **)(*in_RDI + 400))(in_RDI,local_1ec);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        dVar14 = TwoStageDynamicBayesianNetwork::GetOProbability
                           ((TwoStageDynamicBayesianNetwork *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            in_stack_fffffffffffffca8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                            &in_stack_fffffffffffffc98->super_SDT,in_stack_fffffffffffffc90);
        bVar2 = Globals::EqualProbability
                          ((double)in_stack_fffffffffffffb30,(double)in_stack_fffffffffffffb28);
        if (!bVar2) {
          uVar11 = (**(code **)((local_a0->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + 10))
                             (local_a0,IVar3,local_1b8._76_4_,IVar4,local_1ec);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar11;
          auVar15._8_8_ = 0;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar14 * dVar13;
          auVar17 = vfmadd213sd_fma(auVar15,auVar17,auVar18);
          if (1e-12 < auVar17._0_8_) {
            (**(code **)((local_a0->super_SDT).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xe))
                      (auVar17._0_8_,local_a0,IVar3,local_1b8._76_4_,IVar4,local_1ec);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40)
        ;
      }
      Scope::~Scope((Scope *)0xaeab95);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40);
      bVar2 = IndexTools::Increment
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    } while (((((bVar2 ^ 0xffU) & 1) != 0) ||
             (bVar2 = IndexTools::Increment
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)),
             ((bVar2 ^ 0xffU) & 1) != 0)) ||
            (bVar2 = IndexTools::Increment
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)),
            ((bVar2 ^ 0xffU) & 1) != 0));
    (**(code **)(*in_RDI + 0x10))();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb30,
               (size_type)in_stack_fffffffffffffb28,(value_type_conflict1 *)0xaeac83);
    for (local_228 = 0; (pointer)(ulong)local_228 < local_30; local_228 = local_228 + 1) {
      for (local_22c = 0; uVar11 = (**(code **)(*in_RDI + 0x110))(), local_22c < uVar11;
          local_22c = local_22c + 1) {
        for (local_230 = 0; (pointer)(ulong)local_230 < local_30; local_230 = local_230 + 1) {
          local_238 = 0.0;
          for (local_23c = 0; uVar11 = (**(code **)(*in_RDI + 0x170))(), local_23c < uVar11;
              local_23c = local_23c + 1) {
            dVar13 = (double)(**(code **)((local_a0->super_SDT).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 10))
                                       (local_a0,local_228,local_22c,local_230,local_23c);
            local_238 = dVar13 + local_238;
          }
          local_240 = 0;
          while( true ) {
            uVar11 = (ulong)local_240;
            uVar12 = (**(code **)(*in_RDI + 0x170))();
            if (uVar12 <= uVar11) break;
            if (local_238 <= 0.0) {
              pSVar9 = local_a0;
              uVar19 = local_228;
              uVar20 = local_22c;
              uVar21 = local_230;
              uVar22 = local_240;
              uVar5 = (**(code **)(*in_RDI + 0x170))();
              auVar16._8_56_ = extraout_var;
              auVar16._0_8_ = extraout_XMM0_Qa;
              auVar15 = vcvtusi2sd_avx512f(auVar16._0_16_,uVar5);
              (**(code **)((pSVar9->super_SDT).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0xe))
                        (1.0 / auVar15._0_8_,pSVar9,uVar19,uVar20,uVar21,uVar22);
            }
            else {
              dVar13 = (double)(**(code **)((local_a0->super_SDT).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 10))
                                         (local_a0,local_228,local_22c,local_230,local_240);
              if (1e-12 < dVar13) {
                (**(code **)((local_a0->super_SDT).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + 0xe))
                          (dVar13 / local_238,local_a0,local_228,local_22c,local_230,local_240);
              }
            }
            local_240 = local_240 + 1;
          }
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x48) & 1) != 0) && ((long *)in_RDI[0x46] != (long *)0x0)) {
      (**(code **)(*(long *)in_RDI[0x46] + 8))();
    }
    if (((*(byte *)((long)in_RDI + 0x242) & 1) != 0) && ((long *)in_RDI[0x47] != (long *)0x0)) {
      (**(code **)(*(long *)in_RDI[0x47] + 8))();
    }
    in_RDI[0x46] = (long)local_98;
    in_RDI[0x47] = (long)local_a0;
    *(undefined1 *)(in_RDI + 0x48) = 1;
    *(undefined1 *)((long)in_RDI + 0x242) = 1;
    RemoveStateFactor(in_stack_00000080,in_stack_0000007c);
    SanityCheck(in_stack_fffffffffffffb30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb40);
    Scope::~Scope((Scope *)0xaeb0e0);
    Scope::~Scope((Scope *)0xaeb0ed);
    Scope::~Scope((Scope *)0xaeb0fa);
    Scope::~Scope((Scope *)0xaeb107);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40);
    return;
  }
  uVar5 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),in_stack_fffffffffffffb58)
  ;
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel(const Index sf, bool sparse)
{
    const Scope& YSoI_sf = _m_2dbn.GetYSoI_Y(sf);
  
    if(!YSoI_sf.empty()){
      throw E("Cannot marginalize a state factor with NS dependencies. NYI.");
    }

    cout << "Marginalizing State Factor " << sf << endl;

    size_t nrS = 1;
    vector<size_t> new_factor_sizes;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
        if(i == sf)
            continue;
        size_t nrX = GetNrValuesForFactor(i);
        nrS *= nrX;
        new_factor_sizes.push_back(nrX);
    }
    vector<size_t> input_factor_sizes = GetNrValuesPerFactor();
    input_factor_sizes[sf] = 1;
    vector<size_t> output_factor_sizes = GetNrValuesPerFactor();
    const vector<size_t>& actions = GetNrActions();

    if(!_m_cached_FlatTM)
        ConstructJointActions();
    if(!_m_cached_FlatOM)
        ConstructJointObservations();
    
    TransitionModelDiscrete* marginalized_tm;
    ObservationModelDiscrete* marginalized_om;

    _m_sparse_FlatTM = sparse;
    _m_sparse_FlatOM = sparse;

    if(_m_eventObservability)
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                EventObservationModelMappingSparse(nrS,
                                                   GetNrJointActions(), 
                                                   GetNrJointObservations());
        else
            marginalized_om = new 
                EventObservationModelMapping(nrS,
                                             GetNrJointActions(), 
                                             GetNrJointObservations());
    }
    else
    {
        if(_m_sparse_FlatTM)
            marginalized_tm = new 
                TransitionModelMappingSparse(nrS,
                                             GetNrJointActions());
        else
            marginalized_tm = new 
                TransitionModelMapping(nrS,
                                       GetNrJointActions());      
        if(_m_sparse_FlatOM)
            marginalized_om = new 
                ObservationModelMappingSparse(nrS,
                                              GetNrJointActions(), 
                                              GetNrJointObservations());
        else
            marginalized_om = new 
                ObservationModelMapping(nrS,
                                        GetNrJointActions(), 
                                        GetNrJointObservations());
    }

    Scope XScope = GetAllStateFactorScope();
    Scope YScope(XScope);
    Scope AScope;
    for(size_t i = 0; i < GetNrAgents(); i++)
        AScope.Insert(i);
    Scope sfScope;
    sfScope.Insert(sf);

    vector<Index> X(GetNrStateFactors(),0);
    vector<Index> A(GetNrAgents(),0);
    vector<Index> Y(GetNrStateFactors(),0);
    do{
        do{
            do{
                Index jaI = IndividualToJointActionIndices(A);
                vector<Index> post_X;
                vector<Index> post_Y;
                Scope post_Y_Sc;
                for(size_t i = 0; i < Y.size(); i++)
                    if(i != sf){
                        post_X.push_back(X[i]);
                        post_Y.push_back(Y[i]);
                        post_Y_Sc.Insert(i);
                    }

                Index post_sI = IndexTools::IndividualToJointIndices(post_X, new_factor_sizes);
                Index post_sucsI = IndexTools::IndividualToJointIndices(post_Y, new_factor_sizes);
        
                double p_t = _m_2dbn.GetYProbability(X,A,Y);
                if(! Globals::EqualProbability(p_t, 0) )
                {
                    double post_p_t = marginalized_tm->Get(post_sI, jaI, post_sucsI);
                    double p_t_sum = post_p_t+p_t;
                    if(p_t_sum > Globals::PROB_PRECISION)
                        marginalized_tm->Set(post_sI, jaI, post_sucsI, p_t_sum); //marginalization
                }
                double post_p_given_sf = _m_2dbn.GetYProbabilityGeneral(XScope,
                                                                        X,
                                                                        AScope,
                                                                        A,
                                                                        YScope,
                                                                        Y,
                                                                        post_Y_Sc,
                                                                        post_Y);

                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    vector<Index> O = JointToIndividualObservationIndices(joI);
    
                    double p_o = _m_2dbn.GetOProbability(X,A,Y,O);
                    if(! Globals::EqualProbability(p_o, 0) )
                    {
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        double p_o_sum = post_p_o + p_o*post_p_given_sf*p_t;
                        if(p_o_sum > Globals::PROB_PRECISION)
                            marginalized_om->Set(post_sI, jaI, post_sucsI, joI, p_o_sum); //marginalization
                    }
                }
            }while(!IndexTools::Increment( Y, output_factor_sizes ));
        }while(!IndexTools::Increment( A, actions ));
    }while(!IndexTools::Increment( X, input_factor_sizes ));

    A.assign(GetNrAgents(),0);
    //now we need to sanitize the observation model.
    for(Index post_sI = 0; post_sI < nrS; post_sI++){
        for(Index jaI = 0; jaI < GetNrJointActions(); jaI++){
            for(Index post_sucsI = 0; post_sucsI < nrS; post_sucsI++){
                double p_total = 0;
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    p_total += marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                }
                for(Index joI = 0; joI < GetNrJointObservations(); joI++){
                    if(p_total > 0){
                        double post_p_o = marginalized_om->Get(post_sI, jaI, post_sucsI, joI);
                        if(post_p_o > Globals::PROB_PRECISION)
                          marginalized_om->Set(post_sI, jaI, post_sucsI, joI, post_p_o/p_total); //normalization
                    }
                    else
                        marginalized_om->Set(post_sI, jaI, post_sucsI, joI, 1.0/GetNrJointObservations()); //impossible transition
                }
            }
        }
    }
    
    if(_m_cached_FlatTM)
        delete(_m_p_tModel);
    if(_m_cached_FlatOM)
        delete(_m_p_oModel);

    _m_p_tModel = marginalized_tm;
    _m_p_oModel = marginalized_om;

    _m_cached_FlatTM = true;
    _m_cached_FlatOM = true;  

    RemoveStateFactor(sf);

    SanityCheck();
}